

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexReader::readLargeMetaDataHeaders
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  bool bVar1;
  char *pcVar2;
  uint32_t *puVar3;
  FilePos in_stack_ffffffffffffff58;
  PtexReader *in_stack_ffffffffffffff60;
  char *local_98;
  uint32_t zipsizeval;
  uint32_t datasize;
  uint8_t datatypeval;
  char *key;
  uint8_t keysize;
  char *end;
  char *ptr;
  char *buff;
  bool useNew;
  size_t *metaDataMemUsed_local;
  int memsize_local;
  int zipsize_local;
  FilePos pos_local;
  MetaData *metadata_local;
  PtexReader *this_local;
  
  puVar3 = (uint32_t *)&stack0xffffffffffffff58;
  seek(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (0x4000 < memsize) {
    local_98 = (char *)operator_new__((long)memsize);
  }
  else {
    puVar3 = (uint32_t *)(&stack0xffffffffffffff58 + -((long)memsize + 0xfU & 0xfffffffffffffff0));
    local_98 = (char *)puVar3;
  }
  puVar3[-2] = 0x10f979;
  puVar3[-1] = 0;
  bVar1 = readZipBlock(this,local_98,zipsize,memsize);
  if (bVar1) {
    end = local_98;
    while (end < local_98 + memsize) {
      pcVar2 = end + (long)(int)(uint)(byte)*end + 6;
      end = end + (long)(int)(uint)(byte)*end + 10;
      puVar3[-4] = *(undefined4 *)pcVar2;
      *(size_t **)(puVar3 + -2) = metaDataMemUsed;
      puVar3[-6] = 0x10fa5d;
      puVar3[-5] = 0;
      MetaData::addLmdEntry
                (*(MetaData **)(puVar3 + 6),*(uint8_t *)((long)puVar3 + 0x17),*(char **)(puVar3 + 2)
                 ,*(uint8_t *)((long)puVar3 + 7),*puVar3,*(FilePos *)(puVar3 + -2),puVar3[10],
                 *(size_t **)(puVar3 + 0xc));
    }
  }
  if ((0x4000 < memsize) && (local_98 != (char *)0x0)) {
    puVar3[-2] = 0x10fa96;
    puVar3[-1] = 0;
    operator_delete__(local_98);
  }
  return;
}

Assistant:

void PtexReader::readLargeMetaDataHeaders(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char [memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        pos += zipsize;

        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            uint32_t zipsizeval; memcpy(&zipsizeval, ptr, sizeof(zipsizeval));
            ptr += sizeof(zipsizeval);
            metadata->addLmdEntry((uint8_t)(keysize-1), key, datatypeval, datasize, pos, zipsizeval, metaDataMemUsed);
            pos += zipsizeval;
        }
    }
    if (useNew) delete [] buff;
}